

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O3

handle pybind11::detail::
       map_caster<std::map<unsigned_long,std::vector<long,std::allocator<long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<long,std::allocator<long>>>>>,unsigned_long,std::vector<long,std::allocator<long>>>
       ::
       cast<std::map<unsigned_long,std::vector<long,std::allocator<long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<long,std::allocator<long>>>>>>
                 (map<unsigned_long,_std::vector<long,_std::allocator<long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<long,_std::allocator<long>_>_>_>_>
                  *src,return_value_policy policy,handle parent)

{
  _Rb_tree_node_base *p_Var1;
  handle hVar2;
  dict d;
  object value;
  object key;
  handle local_70;
  handle local_68;
  object local_60 [2];
  handle local_50;
  handle local_48;
  object local_40;
  object local_38;
  
  dict::dict((dict *)&local_70);
  p_Var1 = *(_Rb_tree_node_base **)(src + 0x18);
  if (p_Var1 != (_Rb_tree_node_base *)(src + 8)) {
    do {
      local_60[0].super_handle.m_ptr = (handle)PyLong_FromSize_t(*(undefined8 *)(p_Var1 + 1));
      local_68 = list_caster<std::vector<long,std::allocator<long>>,long>::
                 cast<std::vector<long,std::allocator<long>>>
                           ((vector<long,_std::allocator<long>_> *)&p_Var1[1]._M_parent,policy,
                            parent);
      if ((local_60[0].super_handle.m_ptr == (PyObject *)0x0) || (local_68.m_ptr == (PyObject *)0x0)
         ) {
        object::~object((object *)&local_68);
        object::~object(local_60);
        hVar2.m_ptr = (PyObject *)0x0;
        goto LAB_001ef47d;
      }
      *(long *)local_60[0].super_handle.m_ptr = *(long *)local_60[0].super_handle.m_ptr + 1;
      local_50.m_ptr = local_70.m_ptr;
      local_48 = local_60[0].super_handle.m_ptr;
      local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
      local_40.super_handle.m_ptr = (handle)(PyObject *)0x0;
      object::~object(&local_38);
      accessor_policies::generic_item::set(local_50,local_48,local_68);
      object::~object(&local_40);
      object::~object((object *)&local_48);
      object::~object((object *)&local_68);
      object::~object(local_60);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while (p_Var1 != (_Rb_tree_node_base *)(src + 8));
  }
  hVar2.m_ptr = local_70.m_ptr;
  local_70.m_ptr = (PyObject *)0x0;
LAB_001ef47d:
  object::~object((object *)&local_70);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        dict d;
        return_value_policy policy_key = policy;
        return_value_policy policy_value = policy;
        if (!std::is_lvalue_reference<T>::value) {
            policy_key = return_value_policy_override<Key>::policy(policy_key);
            policy_value = return_value_policy_override<Value>::policy(policy_value);
        }
        for (auto &&kv : src) {
            auto key = reinterpret_steal<object>(key_conv::cast(forward_like<T>(kv.first), policy_key, parent));
            auto value = reinterpret_steal<object>(value_conv::cast(forward_like<T>(kv.second), policy_value, parent));
            if (!key || !value)
                return handle();
            d[key] = value;
        }
        return d.release();
    }